

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O3

optional_ptr<duckdb::PersistentCollectionData,_true> __thiscall
duckdb::SingleFileStorageCommitState::GetRowGroupData
          (SingleFileStorageCommitState *this,DataTable *table,idx_t start_index,idx_t *count)

{
  __node_base_ptr p_Var1;
  iterator iVar2;
  idx_t local_18;
  key_type local_10;
  
  local_18 = start_index;
  local_10._M_data = table;
  p_Var1 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->optimistically_written_data)._M_h,
                      (ulong)table % (this->optimistically_written_data)._M_h._M_bucket_count,
                      &local_10,(__hash_code)table);
  if (((p_Var1 != (__node_base_ptr)0x0) && (p_Var1->_M_nxt != (_Hash_node_base *)0x0)) &&
     (iVar2 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(p_Var1->_M_nxt + 2),&local_18),
     iVar2.
     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_false>
     ._M_cur != (__node_type *)0x0)) {
    *count = *(idx_t *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_false>
                              ._M_cur + 0x18);
    return (optional_ptr<duckdb::PersistentCollectionData,_true>)
           *(PersistentCollectionData **)
            ((long)iVar2.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_false>
                   ._M_cur + 0x20);
  }
  return (optional_ptr<duckdb::PersistentCollectionData,_true>)(PersistentCollectionData *)0x0;
}

Assistant:

optional_ptr<PersistentCollectionData> SingleFileStorageCommitState::GetRowGroupData(DataTable &table,
                                                                                     idx_t start_index, idx_t &count) {
	auto entry = optimistically_written_data.find(table);
	if (entry == optimistically_written_data.end()) {
		// no data for this table
		return nullptr;
	}
	auto &row_groups = entry->second;
	auto start_entry = row_groups.find(start_index);
	if (start_entry == row_groups.end()) {
		// this row group was not optimistically written
		return nullptr;
	}
	count = start_entry->second.count;
	return start_entry->second.row_group_data.get();
}